

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pid.c
# Opt level: O1

inform_pid_lattice *
inform_pid(int *stimulus,int *responses,size_t l,size_t n,int bs,int *br,inform_error *err)

{
  inform_pid_source *piVar1;
  uint64_t uVar2;
  uint32_t *puVar3;
  inform_pid_source *piVar4;
  inform_pid_source *b;
  _Bool _Var5;
  int iVar6;
  size_t i;
  ulong uVar7;
  EVP_PKEY_CTX *ctx;
  size_t *psVar8;
  size_t *psVar9;
  gvector pvVar10;
  inform_dist *piVar11;
  int *piVar12;
  uint *__s;
  gvector pvVar13;
  size_t sVar14;
  inform_pid_source *piVar15;
  inform_pid_source **ppiVar16;
  inform_pid_lattice *piVar17;
  inform_pid_source **ppiVar18;
  inform_pid_source *piVar19;
  ulong uVar20;
  inform_pid_source *piVar21;
  size_t k;
  uint *puVar22;
  inform_pid_source *piVar23;
  uint uVar24;
  size_t sVar25;
  inform_error iVar26;
  size_t s_1;
  ulong uVar27;
  size_t j;
  size_t sVar28;
  int s;
  long lVar29;
  size_t sVar30;
  size_t *v;
  int *piVar31;
  uint *puVar32;
  bool bVar33;
  bool bVar34;
  bool bVar35;
  undefined1 auVar36 [16];
  double dVar37;
  double dVar38;
  undefined4 uVar39;
  undefined4 uVar40;
  double dVar41;
  ulong local_f0;
  inform_pid_source **local_e0;
  
  if (stimulus == (int *)0x0 || responses == (int *)0x0) {
    if (err == (inform_error *)0x0) {
      return (inform_pid_lattice *)0x0;
    }
    *err = INFORM_ETIMESERIES;
    return (inform_pid_lattice *)0x0;
  }
  if (l == 0) {
    if (err == (inform_error *)0x0) {
      return (inform_pid_lattice *)0x0;
    }
    *err = INFORM_ENOSOURCES;
    return (inform_pid_lattice *)0x0;
  }
  if (n == 0) {
    if (err == (inform_error *)0x0) {
      return (inform_pid_lattice *)0x0;
    }
    *err = INFORM_ESHORTSERIES;
    return (inform_pid_lattice *)0x0;
  }
  if ((bs < 2) || (br == (int *)0x0)) {
    if (err == (inform_error *)0x0) {
      return (inform_pid_lattice *)0x0;
    }
    *err = INFORM_EBASE;
    return (inform_pid_lattice *)0x0;
  }
  bVar33 = true;
  if (1 < *br) {
    uVar20 = 0;
    do {
      if (l - 1 == uVar20) goto LAB_0015a009;
      uVar7 = uVar20 + 1;
      lVar29 = uVar20 + 1;
      uVar20 = uVar7;
    } while (1 < br[lVar29]);
    bVar33 = uVar7 < l;
  }
  if (err != (inform_error *)0x0) {
    *err = INFORM_EBASE;
  }
  if (bVar33) {
    return (inform_pid_lattice *)0x0;
  }
LAB_0015a009:
  uVar7 = n + (n == 0);
  bVar33 = true;
  uVar20 = 1;
  do {
    if (stimulus[uVar20 - 1] < 0) {
      iVar26 = INFORM_ENEGSTATE;
LAB_0015a09e:
      if (err != (inform_error *)0x0) {
        *err = iVar26;
      }
      if (bVar33) {
        return (inform_pid_lattice *)0x0;
      }
      break;
    }
    if (bs <= stimulus[uVar20 - 1]) {
      iVar26 = INFORM_EBADSTATE;
      goto LAB_0015a09e;
    }
    bVar33 = uVar20 < n;
    bVar34 = uVar20 != uVar7;
    uVar20 = uVar20 + 1;
  } while (bVar34);
  bVar33 = true;
  uVar20 = 0;
  piVar12 = responses;
  do {
    bVar34 = true;
    uVar27 = 1;
    do {
      if (piVar12[uVar27 - 1] < 0) {
        iVar26 = INFORM_ENEGSTATE;
LAB_0015a10f:
        if (err != (inform_error *)0x0) {
          *err = iVar26;
        }
        if (bVar34) goto LAB_0015a12e;
        break;
      }
      if (br[uVar20] <= piVar12[uVar27 - 1]) {
        iVar26 = INFORM_EBADSTATE;
        goto LAB_0015a10f;
      }
      bVar34 = uVar27 < n;
      bVar35 = uVar27 != uVar7;
      uVar27 = uVar27 + 1;
    } while (bVar35);
    uVar20 = uVar20 + 1;
    bVar33 = uVar20 < l;
    piVar12 = piVar12 + n;
  } while (uVar20 != l + (l == 0));
LAB_0015a12e:
  if (bVar33) {
    return (inform_pid_lattice *)0x0;
  }
  uVar20 = (ulong)(1 << ((byte)l & 0x1f));
  ctx = (EVP_PKEY_CTX *)gvector_alloc(uVar20 - 1,uVar20 - 1,8);
  memset(ctx,0,*(long *)(ctx + -8) << 3);
  if (ctx == (EVP_PKEY_CTX *)0x0) {
LAB_0015a328:
    if (err != (inform_error *)0x0) {
      *err = INFORM_ENOMEM;
    }
LAB_0015a334:
    ctx = (EVP_PKEY_CTX *)0x0;
  }
  else if ((int)l != 0) {
    uVar7 = 2;
    if (2 < uVar20) {
      uVar7 = uVar20;
    }
    local_f0 = 1;
    do {
      psVar8 = (size_t *)gvector_alloc(l,0,8);
      if (psVar8 == (size_t *)0x0) {
        if (*(long *)(ctx + -8) != 0) {
          uVar20 = 0;
          do {
            gvector_free(*(gvector *)(ctx + uVar20 * 8));
            uVar20 = uVar20 + 1;
          } while (uVar20 < *(ulong *)(ctx + -8));
        }
        gvector_free(ctx);
        goto LAB_0015a328;
      }
      bVar33 = true;
      sVar28 = 0;
      do {
        if ((local_f0 & (long)(1 << ((byte)sVar28 & 0x1f))) != 0) {
          psVar9 = push_value(psVar8,sVar28);
          v = psVar9;
          if (psVar9 == (size_t *)0x0) {
            gvector_free(psVar8);
            if (*(long *)(ctx + -8) != 0) {
              uVar20 = 0;
              do {
                gvector_free(*(gvector *)(ctx + uVar20 * 8));
                uVar20 = uVar20 + 1;
              } while (uVar20 < *(ulong *)(ctx + -8));
            }
            gvector_free(ctx);
            v = psVar8;
            if (err != (inform_error *)0x0) {
              *err = INFORM_ENOMEM;
            }
          }
          psVar8 = v;
          if (psVar9 == (size_t *)0x0) break;
        }
        sVar28 = sVar28 + 1;
        bVar33 = sVar28 < l;
        v = psVar8;
      } while (sVar28 != l);
      if (bVar33) {
        ctx = (EVP_PKEY_CTX *)0x0;
        break;
      }
      pvVar10 = gvector_shrink(v);
      if (pvVar10 == (gvector)0x0) {
        gvector_free(v);
        if (*(long *)(ctx + -8) != 0) {
          uVar20 = 0;
          do {
            gvector_free(*(gvector *)(ctx + uVar20 * 8));
            uVar20 = uVar20 + 1;
          } while (uVar20 < *(ulong *)(ctx + -8));
        }
        gvector_free(ctx);
        if (err != (inform_error *)0x0) {
          *err = INFORM_ENOMEM;
        }
      }
      else {
        *(gvector *)(ctx + local_f0 * 8 + -8) = pvVar10;
      }
      if (pvVar10 == (gvector)0x0) goto LAB_0015a334;
      local_f0 = local_f0 + 1;
    } while (local_f0 != uVar7);
  }
  if ((err != (inform_error *)0x0) && (*err != INFORM_SUCCESS)) {
    return (inform_pid_lattice *)0x0;
  }
  sVar28 = *(size_t *)(ctx + -8);
  piVar11 = inform_dist_infer(stimulus,n);
  if ((piVar11 == (inform_dist *)0x0) ||
     (pvVar10 = gvector_alloc(sVar28,sVar28,8), pvVar10 == (gvector)0x0)) {
    cleanup(ctx);
    if (err != (inform_error *)0x0) {
      *err = INFORM_ENOMEM;
      return (inform_pid_lattice *)0x0;
    }
    return (inform_pid_lattice *)0x0;
  }
  if (sVar28 != 0) {
    memset(pvVar10,0,sVar28 * 8);
    auVar36._8_4_ = (int)(n >> 0x20);
    auVar36._0_8_ = n;
    auVar36._12_4_ = 0x45300000;
    uVar20 = (ulong)(uint)bs;
    sVar14 = 0;
    do {
      lVar29 = *(long *)(ctx + sVar14 * 8);
      sVar30 = *(size_t *)(lVar29 + -8);
      sVar25 = (sVar30 + 1) * n;
      piVar12 = (int *)gvector_alloc(sVar25,sVar25,4);
      if (piVar12 == (int *)0x0) {
joined_r0x0015a518:
        if (err != (inform_error *)0x0) {
          *err = INFORM_ENOMEM;
          pvVar13 = (gvector)0x0;
          goto LAB_0015a742;
        }
        *(undefined8 *)((long)pvVar10 + sVar14 * 8) = 0;
      }
      else {
        if (sVar30 != 0) {
          sVar25 = 0;
          piVar31 = piVar12;
          do {
            memcpy(piVar31,responses + *(long *)(lVar29 + sVar25 * 8) * n,n * 4);
            sVar25 = sVar25 + 1;
            piVar31 = piVar31 + n;
          } while (sVar30 != sVar25);
        }
        piVar31 = piVar12 + sVar30 * n;
        inform_black_box(piVar12,sVar30,1,n,br,(size_t *)0x0,(size_t *)0x0,piVar31,err);
        _Var5 = inform_failed(err);
        if (!_Var5) {
          if (sVar30 == 0) {
            uVar24 = 1;
          }
          else {
            uVar24 = 1;
            sVar25 = 0;
            do {
              uVar24 = uVar24 * br[*(long *)(lVar29 + sVar25 * 8)];
              sVar25 = sVar25 + 1;
            } while (sVar30 != sVar25);
          }
          lVar29 = (long)(int)(uVar24 * bs);
          sVar30 = (int)uVar24 + lVar29;
          __s = (uint *)gvector_alloc(sVar30,sVar30,4);
          if (__s != (uint *)0x0) {
            if (sVar30 != 0) {
              memset(__s,0,sVar30 * 4);
            }
            sVar30 = 0;
            do {
              __s[lVar29 + piVar31[sVar30]] = __s[lVar29 + piVar31[sVar30]] + 1;
              __s[(long)piVar31[sVar30] * (long)bs + (long)stimulus[sVar30]] =
                   __s[(long)piVar31[sVar30] * (long)bs + (long)stimulus[sVar30]] + 1;
              sVar30 = sVar30 + 1;
            } while (n != sVar30);
            pvVar13 = gvector_alloc(uVar20,uVar20,8);
            if (pvVar13 != (gvector)0x0) {
              uVar7 = 0;
              puVar22 = __s;
              do {
                *(undefined8 *)((long)pvVar13 + uVar7 * 8) = 0;
                if (piVar11->histogram[uVar7] != 0) {
                  dVar38 = (double)piVar11->histogram[uVar7];
                  if (0 < (int)uVar24) {
                    uVar27 = 0;
                    puVar32 = puVar22;
                    do {
                      if ((__s[lVar29 + uVar27] != 0) && (*puVar32 != 0)) {
                        dVar37 = (double)*puVar32;
                        dVar41 = log2((((auVar36._8_8_ - 1.9342813113834067e+25) +
                                       ((double)CONCAT44(0x43300000,(int)n) - 4503599627370496.0)) *
                                      dVar37) / ((double)__s[lVar29 + uVar27] * dVar38));
                        *(double *)((long)pvVar13 + uVar7 * 8) =
                             dVar41 * dVar37 + *(double *)((long)pvVar13 + uVar7 * 8);
                      }
                      uVar27 = uVar27 + 1;
                      puVar32 = puVar32 + uVar20;
                    } while (uVar24 != uVar27);
                  }
                  *(double *)((long)pvVar13 + uVar7 * 8) =
                       *(double *)((long)pvVar13 + uVar7 * 8) / dVar38;
                }
                uVar7 = uVar7 + 1;
                puVar22 = puVar22 + 1;
              } while (uVar7 != uVar20);
              gvector_free(__s);
              gvector_free(piVar12);
              goto LAB_0015a742;
            }
            gvector_free(__s);
          }
          gvector_free(piVar12);
          goto joined_r0x0015a518;
        }
        gvector_free(piVar12);
        pvVar13 = (gvector)0x0;
LAB_0015a742:
        *(gvector *)((long)pvVar10 + sVar14 * 8) = pvVar13;
        if ((err != (inform_error *)0x0) && (*err != INFORM_SUCCESS)) goto LAB_0015aa3d;
      }
      sVar14 = sVar14 + 1;
    } while (sVar14 != sVar28);
  }
  local_e0 = (inform_pid_source **)gvector_alloc(0,0,8);
  if (local_e0 == (inform_pid_source **)0x0) {
LAB_0015a94a:
    if (err != (inform_error *)0x0) {
      *err = INFORM_ENOMEM;
    }
LAB_0015a956:
    ppiVar16 = (inform_pid_source **)0x0;
  }
  else {
    bVar33 = (int)l == 0;
    if (!bVar33) {
      uVar7 = (ulong)(uint)~(-1 << ((byte)l & 0x1f));
      bVar33 = false;
      uVar20 = 1;
      do {
        psVar8 = (size_t *)gvector_alloc(1,1,8);
        if (psVar8 == (size_t *)0x0) {
          if (err != (inform_error *)0x0) {
            *err = INFORM_ENOMEM;
          }
LAB_0015a8c7:
          bVar34 = false;
        }
        else {
          *psVar8 = uVar20;
          piVar15 = alloc_source(psVar8,err);
          if ((err == (inform_error *)0x0) || (*err == INFORM_SUCCESS)) {
            ppiVar16 = push_source(local_e0,piVar15);
            if (ppiVar16 == (inform_pid_source **)0x0) {
              free_source(piVar15);
              free_all_sources(local_e0);
              gvector_free(psVar8);
              if (err != (inform_error *)0x0) {
                *err = INFORM_ENOMEM;
              }
              bVar34 = false;
            }
            else {
              local_e0 = sources_rec(uVar20 + 1,uVar7,psVar8,ppiVar16,err);
              bVar34 = true;
              if ((err != (inform_error *)0x0) && (*err != INFORM_SUCCESS)) {
                free_all_sources(local_e0);
                goto LAB_0015a8c7;
              }
            }
          }
          else {
            gvector_free(psVar8);
            bVar34 = false;
          }
        }
        if (!bVar34) break;
        bVar33 = uVar7 <= uVar20;
        lVar29 = (-(ulong)(uVar7 == 0) - uVar7) + 1 + uVar20;
        uVar20 = uVar20 + 1;
      } while (lVar29 != 1);
    }
    if (!bVar33) goto LAB_0015a956;
    ppiVar16 = (inform_pid_source **)gvector_shrink(local_e0);
    if (ppiVar16 == (inform_pid_source **)0x0) {
      free_all_sources(local_e0);
      goto LAB_0015a94a;
    }
  }
  if (err == (inform_error *)0x0) {
    toposort(ppiVar16,(inform_error *)0x0);
LAB_0015a9c5:
    if ((ppiVar16 == (inform_pid_source **)0x0) ||
       (piVar15 = ppiVar16[-1], piVar15 == (inform_pid_source *)0x0)) {
      if (err != (inform_error *)0x0) {
        *err = INFORM_EARG;
      }
LAB_0015aa23:
      piVar17 = (inform_pid_lattice *)0x0;
    }
    else {
      piVar17 = (inform_pid_lattice *)malloc(0x20);
      if (piVar17 == (inform_pid_lattice *)0x0) {
        if (err != (inform_error *)0x0) {
          *err = INFORM_ENOMEM;
        }
        piVar17 = (inform_pid_lattice *)0x0;
      }
      else {
        piVar17->sources = (inform_pid_source **)0x0;
        piVar17->top = (inform_pid_source *)0x0;
        piVar17->bottom = (inform_pid_source *)0x0;
      }
      if ((err != (inform_error *)0x0) && (*err != INFORM_SUCCESS)) goto LAB_0015aa23;
      piVar21 = (inform_pid_source *)0x0;
      do {
        piVar1 = (inform_pid_source *)((long)&piVar21->name + 1);
        piVar19 = piVar1;
        if (piVar1 < piVar15) {
          do {
            piVar4 = ppiVar16[(long)piVar21];
            b = ppiVar16[(long)piVar19];
            _Var5 = below(piVar4,b);
            if (_Var5) {
              ppiVar18 = piVar4->above;
              piVar4 = ppiVar18[-1];
              if (piVar4 == (inform_pid_source *)0x0) {
LAB_0015ad12:
                ppiVar18 = push_source(ppiVar18,b);
                if (ppiVar18 == (inform_pid_source **)0x0) {
                  free_all_sources(ppiVar16);
                }
                else {
                  ppiVar16[(long)piVar21]->above = ppiVar18;
                  piVar4 = ppiVar16[(long)piVar21];
                  psVar8 = &piVar4->n_above;
                  *psVar8 = *psVar8 + 1;
                  ppiVar18 = push_source(ppiVar16[(long)piVar19]->below,piVar4);
                  if (ppiVar18 != (inform_pid_source **)0x0) {
                    ppiVar16[(long)piVar19]->below = ppiVar18;
                    ppiVar16[(long)piVar19]->n_below = ppiVar16[(long)piVar19]->n_below + 1;
                    iVar6 = 0;
                    bVar33 = true;
                    goto LAB_0015ad89;
                  }
                  free_all_sources(ppiVar16);
                }
                if (err != (inform_error *)0x0) {
                  *err = INFORM_ENOMEM;
                }
                iVar6 = 1;
                bVar33 = false;
              }
              else {
                piVar23 = (inform_pid_source *)0x1;
                bVar33 = false;
                do {
                  _Var5 = below(ppiVar18[(long)((long)&piVar23[-1].pi + 7)],b);
                  if (_Var5) {
                    bVar33 = true;
                  }
                } while ((piVar23 < piVar4) &&
                        (piVar23 = (inform_pid_source *)((long)&piVar23->name + 1), !_Var5));
                if (!bVar33) goto LAB_0015ad12;
                iVar6 = 0xd;
                bVar33 = false;
              }
LAB_0015ad89:
              if (!bVar33) goto LAB_0015adbe;
            }
            piVar19 = (inform_pid_source *)((long)&piVar19->name + 1);
          } while (piVar19 < piVar15);
          iVar6 = 0xd;
LAB_0015adbe:
          if (iVar6 != 0xd) goto LAB_0015aa23;
        }
        piVar21 = piVar1;
      } while (piVar1 != piVar15);
      piVar17->sources = ppiVar16;
      piVar17->bottom = *ppiVar16;
      piVar17->top = ppiVar16[(long)((long)&piVar15[-1].pi + 7)];
      piVar17->size = (size_t)ppiVar16[-1];
    }
    if ((err == (inform_error *)0x0) || (*err == INFORM_SUCCESS)) goto LAB_0015aa32;
  }
  else if ((*err == INFORM_SUCCESS) && (toposort(ppiVar16,err), *err == INFORM_SUCCESS))
  goto LAB_0015a9c5;
  piVar17 = (inform_pid_lattice *)0x0;
LAB_0015aa32:
  if ((err == (inform_error *)0x0) || (*err == INFORM_SUCCESS)) {
    sVar28 = piVar17->size;
    if (sVar28 != 0) {
      ppiVar16 = piVar17->sources;
      puVar3 = piVar11->histogram;
      uVar2 = piVar11->counts;
      sVar14 = 0;
      do {
        piVar15 = ppiVar16[sVar14];
        piVar15->imin = 0.0;
        lVar29 = *(long *)((long)pvVar10 + *piVar15->name * 8 + -8);
        dVar38 = 0.0;
        uVar20 = 0;
        do {
          dVar41 = *(double *)(lVar29 + uVar20 * 8);
          if (1 < piVar15->size) {
            uVar7 = 1;
            do {
              dVar37 = *(double *)
                        (*(long *)((long)pvVar10 + piVar15->name[uVar7] * 8 + -8) + uVar20 * 8);
              if (dVar37 <= dVar41) {
                dVar41 = dVar37;
              }
              uVar7 = uVar7 + 1;
            } while (piVar15->size != uVar7);
          }
          dVar38 = dVar38 + (double)puVar3[uVar20] * dVar41;
          piVar15->imin = dVar38;
          uVar20 = uVar20 + 1;
        } while (uVar20 != bs + (uint)(bs == 0));
        piVar15->imin =
             piVar15->imin /
             (((double)CONCAT44(0x45300000,(int)(uVar2 >> 0x20)) - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0));
        sVar14 = sVar14 + 1;
      } while (sVar14 != sVar28);
      ppiVar16 = piVar17->sources;
      uVar2 = piVar11->counts;
      puVar3 = piVar11->histogram;
      sVar14 = 0;
      do {
        piVar15 = ppiVar16[sVar14];
        dVar38 = piVar15->pi;
        uVar20 = 0;
        do {
          uVar39 = 0;
          uVar40 = 0xfff00000;
          if (piVar15->n_below != 0) {
            sVar30 = 0;
            do {
              psVar8 = piVar15->below[sVar30]->name;
              uVar7 = piVar15->below[sVar30]->size;
              dVar41 = *(double *)(*(long *)((long)pvVar10 + *psVar8 * 8 + -8) + uVar20 * 8);
              if (1 < uVar7) {
                uVar27 = 1;
                do {
                  dVar37 = *(double *)
                            (*(long *)((long)pvVar10 + psVar8[uVar27] * 8 + -8) + uVar20 * 8);
                  if (dVar37 <= dVar41) {
                    dVar41 = dVar37;
                  }
                  uVar27 = uVar27 + 1;
                } while (uVar7 != uVar27);
              }
              if ((double)CONCAT44(uVar40,uVar39) <= dVar41) {
                uVar39 = SUB84(dVar41,0);
                uVar40 = (undefined4)((ulong)dVar41 >> 0x20);
              }
              sVar30 = sVar30 + 1;
            } while (sVar30 != piVar15->n_below);
          }
          dVar41 = 0.0;
          if ((CONCAT44(uVar40,uVar39) & 0x7fffffffffffffff) != 0x7ff0000000000000) {
            dVar41 = (double)CONCAT44(uVar40,uVar39);
          }
          dVar38 = dVar38 + (double)puVar3[uVar20] * dVar41;
          piVar15->pi = dVar38;
          uVar20 = uVar20 + 1;
        } while (uVar20 != bs + (uint)(bs == 0));
        piVar15->pi = piVar15->imin -
                      piVar15->pi /
                      (((double)CONCAT44(0x45300000,(int)(uVar2 >> 0x20)) - 1.9342813113834067e+25)
                      + ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0));
        sVar14 = sVar14 + 1;
      } while (sVar14 != sVar28);
    }
    cleanup(ctx);
    return piVar17;
  }
LAB_0015aa3d:
  cleanup(ctx);
  return (inform_pid_lattice *)0x0;
}

Assistant:

inform_pid_lattice *inform_pid(int const *stimulus, int const *responses,
        size_t l, size_t n, int bs, int const *br, inform_error *err)
{
    if (check_arguments(stimulus, responses, l, n, bs, br, err))
    {
        return NULL;
    }
    size_t **ss = subsets(l, err);
    if (FAILED(err))
    {
        return NULL;
    }

    size_t const m = gvector_len(ss);

    inform_dist *s_dist = inform_dist_infer(stimulus, n);
    if (s_dist == NULL)
    {
        cleanup(ss, NULL, NULL);
        INFORM_ERROR_RETURN(err, INFORM_ENOMEM, NULL);
    }

    double **si = gvector_alloc(m, m, sizeof(double*));
    if (si == NULL)
    {
        cleanup(ss, s_dist, si);
        INFORM_ERROR_RETURN(err, INFORM_ENOMEM, NULL);
    }
    for (size_t i = 0; i < m; ++i) si[i] = NULL;
    for (size_t i = 0; i < m; ++i)
    {
        si[i] = specific_info(stimulus, responses, l, n, bs, br, ss[i], s_dist, err);
        if (FAILED(err))
        {
            cleanup(ss, s_dist, si);
            return NULL;
        }
    }

    inform_pid_lattice *lattice = hasse(l, err);
    if (FAILED(err))
    {
        cleanup(ss, s_dist, si);
        return NULL;
    }

    for (size_t i = 0; i < lattice->size; ++i)
    {
        inform_pid_source *alpha = lattice->sources[i];
        alpha->imin = 0.0;
        for (size_t s = 0; s < (size_t)bs; ++s)
        {
            double x = si[alpha->name[0]-1][s];
            for (size_t k = 1; k < alpha->size; ++k)
            {
                x = MIN(x, si[alpha->name[k]-1][s]);
            }
            alpha->imin += s_dist->histogram[s] * x;
        }
        alpha->imin /= s_dist->counts;
    }

    for (size_t i = 0; i < lattice->size; ++i)
    {
        inform_pid_source *alpha = lattice->sources[i];
        for (size_t s = 0; s < (size_t)bs; ++s)
        {
            double u = -INFINITY;
            for (size_t j = 0; j < alpha->n_below; ++j)
            {
                inform_pid_source *beta = alpha->below[j];
                double x = si[beta->name[0]-1][s];
                for (size_t k = 1; k < beta->size; ++k)
                {
                    x = MIN(x, si[beta->name[k]-1][s]);
                }
                u = MAX(u, x);
            }
            if (isinf(u))
            {
                u = 0.0;
            }
            alpha->pi += s_dist->histogram[s] * u;
        }
        alpha->pi = alpha->imin - alpha->pi / s_dist->counts;
    }

    cleanup(ss, s_dist, si);

    return lattice;
}